

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlp_overlay.cpp
# Opt level: O1

void __thiscall r_exec::HLPOverlay::~HLPOverlay(HLPOverlay *this)

{
  _Object *p_Var1;
  
  (this->super_Overlay).super__Object._vptr__Object = (_func_int **)&PTR__HLPOverlay_001c00f0;
  std::
  vector<r_code::list<core::P<r_exec::_Fact>_>::cell,_std::allocator<r_code::list<core::P<r_exec::_Fact>_>::cell>_>
  ::~vector(&(this->patterns).cells);
  p_Var1 = (this->bindings).object;
  if (p_Var1 != (_Object *)0x0) {
    LOCK();
    (p_Var1->refCount).super___atomic_base<long>._M_i =
         (p_Var1->refCount).super___atomic_base<long>._M_i + -1;
    UNLOCK();
    if ((p_Var1->refCount).super___atomic_base<long>._M_i < 1) {
      (*p_Var1->_vptr__Object[1])();
    }
  }
  Overlay::~Overlay(&this->super_Overlay);
  return;
}

Assistant:

HLPOverlay::~HLPOverlay()
{
}